

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

InternalParseResult * __thiscall
Catch::Clara::Arg::parse
          (InternalParseResult *__return_storage_ptr__,Arg *this,string *param_1,TokenStream *tokens
          )

{
  element_type *peVar1;
  int iVar2;
  Token *pTVar3;
  TokenStream remainingTokens;
  ParserResult result;
  Result validationResult;
  TokenStream local_100;
  ParseState local_d8;
  undefined1 local_a8 [40];
  ParseState local_80;
  BasicResult<void> local_50;
  
  (*(this->super_ParserRefImpl<Catch::Clara::Arg>).super_ComposableParserImpl<Catch::Clara::Arg>.
    super_ParserBase._vptr_ParserBase[2])(&local_50);
  if (local_50.super_ResultValueBase<void>.super_ResultBase.m_type == Ok) {
    Detail::TokenStream::TokenStream(&local_100,tokens);
    Detail::TokenStream::operator*((Token *)local_a8,&local_100);
    if (local_a8._0_4_ == Argument) {
      iVar2 = (*((this->super_ParserRefImpl<Catch::Clara::Arg>).m_ref.
                 super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_BoundRef[3])();
      if ((char)iVar2 != '\0') {
        __assert_fail("!m_ref->isFlag()",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                      ,0xa24,
                      "virtual Detail::InternalParseResult Catch::Clara::Arg::parse(const std::string &, const Detail::TokenStream &) const"
                     );
      }
      peVar1 = (this->super_ParserRefImpl<Catch::Clara::Arg>).m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      pTVar3 = Detail::TokenStream::operator->(&local_100);
      (*peVar1->_vptr_BoundRef[4])(&local_d8,peVar1,&pTVar3->token);
      if ((int)local_d8.m_remainingTokens.it._M_current == 0) {
        Detail::TokenStream::operator++(&local_100);
        local_80.m_type = Matched;
        Detail::TokenStream::TokenStream(&local_80.m_remainingTokens,&local_100);
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
                  (__return_storage_ptr__,&local_80);
        std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
        ~vector(&local_80.m_remainingTokens.m_tokenBuffer);
      }
      else {
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::
        BasicResult<Catch::Clara::ParseResultType>
                  (__return_storage_ptr__,(BasicResult<Catch::Clara::ParseResultType> *)&local_d8);
      }
      Detail::BasicResult<Catch::Clara::ParseResultType>::~BasicResult
                ((BasicResult<Catch::Clara::ParseResultType> *)&local_d8);
    }
    else {
      local_d8.m_type = NoMatch;
      Detail::TokenStream::TokenStream(&local_d8.m_remainingTokens,&local_100);
      Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
                (__return_storage_ptr__,&local_d8);
      std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
      ~vector(&local_d8.m_remainingTokens.m_tokenBuffer);
    }
    std::__cxx11::string::~string((string *)(local_a8 + 8));
    std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::~vector
              (&local_100.m_tokenBuffer);
  }
  else {
    Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult<void>
              (__return_storage_ptr__,&local_50);
  }
  Detail::BasicResult<void>::~BasicResult(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Detail::InternalParseResult Arg::parse(std::string const&,
                                               Detail::TokenStream const& tokens) const {
            auto validationResult = validate();
            if (!validationResult)
                return Detail::InternalParseResult(validationResult);

            auto remainingTokens = tokens;
            auto const& token = *remainingTokens;
            if (token.type != Detail::TokenType::Argument)
                return Detail::InternalParseResult::ok(Detail::ParseState(
                    ParseResultType::NoMatch, remainingTokens));

            assert(!m_ref->isFlag());
            auto valueRef =
                static_cast<Detail::BoundValueRefBase*>(m_ref.get());

            auto result = valueRef->setValue(remainingTokens->token);
            if (!result)
                return Detail::InternalParseResult(result);
            else
                return Detail::InternalParseResult::ok(Detail::ParseState(
                    ParseResultType::Matched, ++remainingTokens));
        }